

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

void tinyexr::DecompressZip
               (uchar *dst,unsigned_long *uncompressed_size,uchar *src,unsigned_long src_size)

{
  long lVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar2;
  reference pvVar3;
  value_type *pvVar4;
  long *in_RSI;
  value_type *in_RDI;
  char *stop_1;
  char *s;
  char *t2;
  char *t1;
  int d;
  uchar *stop;
  uchar *t;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tmpBuf;
  size_type in_stack_ffffffffffffff38;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff40;
  allocator_type *in_stack_ffffffffffffff50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff60;
  value_type *local_80;
  reference local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_58;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  uchar *in_stack_ffffffffffffffb8;
  mz_ulong *in_stack_ffffffffffffffc0;
  uchar *in_stack_ffffffffffffffc8;
  
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x160599);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_ffffffffffffff60,CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)
             ,in_stack_ffffffffffffff50);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x1605bf);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  mz_uncompress(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  pvVar2 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
           std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                     (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  this = pvVar2;
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                     (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  lVar1 = *in_RSI;
  while (local_58 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    ((long)&(pvVar2->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_start + 1),
        local_58 < (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(pvVar3 + lVar1)) {
    *(value_type *)
     &(local_58->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start =
         *(value_type *)
          &(pvVar2->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start +
         *(value_type *)
          &(local_58->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start + 0x80;
    pvVar2 = local_58;
  }
  local_70 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                       (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                     (local_70,in_stack_ffffffffffffff38);
  lVar1 = *in_RSI;
  local_80 = in_RDI;
  local_78 = pvVar3 + (*in_RSI + 1U >> 1);
  while (local_80 < in_RDI + lVar1) {
    pvVar4 = local_80 + 1;
    *local_80 = *(value_type *)
                 &(local_70->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start;
    if (in_RDI + lVar1 <= pvVar4) break;
    local_80 = local_80 + 2;
    *pvVar4 = *local_78;
    local_78 = local_78 + 1;
    local_70 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               ((long)&(local_70->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                       ._M_impl.super__Vector_impl_data._M_start + 1);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(this);
  return;
}

Assistant:

static void DecompressZip(unsigned char *dst,
                          unsigned long *uncompressed_size /* inout */,
                          const unsigned char *src, unsigned long src_size) {
  std::vector<unsigned char> tmpBuf(*uncompressed_size);

#if TINYEXR_USE_MINIZ
  int ret =
      miniz::mz_uncompress(&tmpBuf.at(0), uncompressed_size, src, src_size);
  assert(ret == miniz::MZ_OK);
  (void)ret;
#else
  int ret = uncompress(&tmpBuf.at(0), uncompressed_size, src, src_size);
  assert(ret == Z_OK);
  (void)ret;
#endif

  //
  // Apply EXR-specific? postprocess. Grabbed from OpenEXR's
  // ImfZipCompressor.cpp
  //

  // Predictor.
  {
    unsigned char *t = &tmpBuf.at(0) + 1;
    unsigned char *stop = &tmpBuf.at(0) + (*uncompressed_size);

    while (t < stop) {
      int d = int(t[-1]) + int(t[0]) - 128;
      t[0] = static_cast<unsigned char>(d);
      ++t;
    }
  }

  // Reorder the pixel data.
  {
    const char *t1 = reinterpret_cast<const char *>(&tmpBuf.at(0));
    const char *t2 = reinterpret_cast<const char *>(&tmpBuf.at(0)) +
                     (*uncompressed_size + 1) / 2;
    char *s = reinterpret_cast<char *>(dst);
    char *stop = s + (*uncompressed_size);

    for (;;) {
      if (s < stop)
        *(s++) = *(t1++);
      else
        break;

      if (s < stop)
        *(s++) = *(t2++);
      else
        break;
    }
  }
}